

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ThreadPool.cpp
# Opt level: O2

void hwnet::ThreadPool::threadFuncSwap(TaskQueue *queue_)

{
  bool bVar1;
  undefined1 local_68 [8];
  taskque local_tasks;
  
  std::_Deque_base<std::shared_ptr<hwnet::Task>,_std::allocator<std::shared_ptr<hwnet::Task>_>_>::
  _Deque_base((_Deque_base<std::shared_ptr<hwnet::Task>,_std::allocator<std::shared_ptr<hwnet::Task>_>_>
               *)local_68);
  while( true ) {
    bVar1 = TaskQueue::Get(queue_,(taskque *)local_68);
    if (!bVar1) break;
    while (local_tasks.
           super__Deque_base<std::shared_ptr<hwnet::Task>,_std::allocator<std::shared_ptr<hwnet::Task>_>_>
           ._M_impl.super__Deque_impl_data._M_start._M_node !=
           (_Map_pointer)
           local_tasks.
           super__Deque_base<std::shared_ptr<hwnet::Task>,_std::allocator<std::shared_ptr<hwnet::Task>_>_>
           ._M_impl.super__Deque_impl_data._M_map_size) {
      (**(code **)**(undefined8 **)
                    local_tasks.
                    super__Deque_base<std::shared_ptr<hwnet::Task>,_std::allocator<std::shared_ptr<hwnet::Task>_>_>
                    ._M_impl.super__Deque_impl_data._M_map_size)();
      std::deque<std::shared_ptr<hwnet::Task>,_std::allocator<std::shared_ptr<hwnet::Task>_>_>::
      pop_front((deque<std::shared_ptr<hwnet::Task>,_std::allocator<std::shared_ptr<hwnet::Task>_>_>
                 *)local_68);
    }
  }
  std::deque<std::shared_ptr<hwnet::Task>,_std::allocator<std::shared_ptr<hwnet::Task>_>_>::~deque
            ((deque<std::shared_ptr<hwnet::Task>,_std::allocator<std::shared_ptr<hwnet::Task>_>_> *)
             local_68);
  return;
}

Assistant:

void ThreadPool::threadFuncSwap(ThreadPool::TaskQueue *queue_) {
	ThreadPool::TaskQueue::taskque local_tasks;
	for(;;) {
		if(!queue_->Get(local_tasks)) {
			return;
		}
		while(!local_tasks.empty()) {
			const Task::Ptr &task = local_tasks.front();
			task->Do();
			local_tasks.pop_front();
		}
	}
}